

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall
presolve::HPresolve::shrinkProblem(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *this_02;
  double *pdVar1;
  double dVar2;
  uint uVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pdVar6;
  pointer pHVar7;
  pointer piVar8;
  pointer psVar9;
  pointer pbVar10;
  pointer puVar11;
  pointer piVar12;
  pointer pdVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  const_iterator __last;
  HighsMipSolver *mipsolver;
  HighsMipSolverData *pHVar15;
  HighsOptions *pHVar16;
  pointer puVar17;
  vector<int,_std::allocator<int>_> *this_03;
  HighsPostsolveStack *this_04;
  _Base_ptr p_Var18;
  HighsLp *pHVar19;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var20;
  pair<int,_int> *ppVar21;
  const_iterator cVar22;
  int iVar23;
  HighsInt *singCol;
  long lVar24;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var25;
  pair<int,_int> *ppVar26;
  HighsInt i_5;
  ulong uVar27;
  pair<int,_int> *rowColPair;
  long lVar28;
  HighsInt i_3;
  long lVar29;
  HighsInt i;
  ulong uVar30;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_bool> pVar31;
  vector<int,_std::allocator<int>_> newColIndex;
  vector<int,_std::allocator<int>_> newRowIndex;
  set<int,_std::less<int>,_std::allocator<int>_> newSet;
  _Vector_base<int,_std::allocator<int>_> local_3e8;
  _Vector_base<int,_std::allocator<int>_> local_3d0;
  ulong local_3b8;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *local_3b0;
  pointer local_3a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_3a0;
  vector<int,_std::allocator<int>_> *local_398;
  pointer local_390;
  vector<int,_std::allocator<int>_> *local_388;
  vector<int,_std::allocator<int>_> *local_380;
  vector<int,_std::allocator<int>_> *local_378;
  HighsPostsolveStack *local_370;
  HighsDomain local_368;
  
  uVar3 = this->model->num_col_;
  uVar27 = (ulong)uVar3;
  this->model->num_col_ = 0;
  local_370 = postsolve_stack;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_3e8,(long)(int)uVar3,
             (allocator_type *)&local_368);
  pbVar4 = (this->model->col_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this->model->col_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_3b0 = &this->implRowDualSourceByCol;
  lVar28 = 0;
  lVar29 = 0;
  local_3b8 = uVar27;
  for (uVar30 = 0; uVar27 != uVar30; uVar30 = uVar30 + 1) {
    if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[uVar30] == '\0') {
      pHVar19 = this->model;
      iVar23 = pHVar19->num_col_;
      lVar24 = (long)iVar23;
      pHVar19->num_col_ = iVar23 + 1;
      local_3e8._M_impl.super__Vector_impl_data._M_start[uVar30] = iVar23;
      if (lVar24 < (long)uVar30) {
        pdVar6 = (pHVar19->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar30];
        pdVar6 = (pHVar19->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar30];
        pdVar6 = (pHVar19->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar30];
        pHVar7 = (pHVar19->integrality_).
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pHVar7[lVar24] = pHVar7[uVar30];
        pdVar6 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar30];
        pdVar6 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar30];
        piVar8 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8[lVar24] = piVar8[uVar30];
        piVar8 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8[local_3e8._M_impl.super__Vector_impl_data._M_start[uVar30]] = piVar8[uVar30];
        psVar9 = (local_3b0->
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=(&psVar9[local_3e8._M_impl.super__Vector_impl_data._M_start[uVar30]]._M_t,
                  (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  ((long)&(psVar9->_M_t)._M_impl.field_0x0 + lVar29));
        piVar8 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8[local_3e8._M_impl.super__Vector_impl_data._M_start[uVar30]] = piVar8[uVar30];
        piVar8 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8[local_3e8._M_impl.super__Vector_impl_data._M_start[uVar30]] = piVar8[uVar30];
        if (pbVar5 != pbVar4) {
          pbVar10 = (this->model->col_names_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::operator=
                    ((string *)
                     (pbVar10 + local_3e8._M_impl.super__Vector_impl_data._M_start[uVar30]),
                     (string *)((long)&(pbVar10->_M_dataplus)._M_p + lVar28));
        }
        puVar11 = (this->changedColFlag).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar11[local_3e8._M_impl.super__Vector_impl_data._M_start[uVar30]] = puVar11[uVar30];
        uVar27 = local_3b8;
      }
    }
    else {
      local_3e8._M_impl.super__Vector_impl_data._M_start[uVar30] = -1;
    }
    lVar29 = lVar29 + 0x30;
    lVar28 = lVar28 + 0x20;
  }
  local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_368.changedcolsflags_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (&this->colDeleted,(long)this->model->num_col_,(value_type_conflict5 *)&local_368);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->col_cost_,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->col_lower_,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->col_upper_,(long)this->model->num_col_);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
            (&this->model->integrality_,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implColLower,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implColUpper,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colLowerSource,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colUpperSource,(long)this->model->num_col_);
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::resize(local_3b0,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colhead,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colsize,(long)this->model->num_col_);
  if (pbVar5 != pbVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->model->col_names_,(long)this->model->num_col_);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->changedColFlag,(long)this->model->num_col_);
  this->numDeletedCols = 0;
  pHVar19 = this->model;
  uVar3 = pHVar19->num_row_;
  local_3a8 = (pHVar19->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_390 = (pHVar19->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pHVar19->num_row_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_3d0,(long)(int)uVar3,
             (allocator_type *)&local_368);
  pbVar4 = local_3a8;
  this_00 = &this->rowDualLowerSource;
  this_01 = &this->rowDualUpperSource;
  this_02 = &this->colImplSourceByRow;
  local_380 = &this->rowroot;
  local_378 = &this->rowsize;
  local_388 = &this->rowsizeInteger;
  local_398 = &this->rowsizeImplInt;
  local_3a0 = &this->changedRowFlag;
  lVar28 = 0;
  lVar29 = 0;
  for (uVar27 = 0; uVar3 != uVar27; uVar27 = uVar27 + 1) {
    if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[uVar27] == '\0') {
      pHVar19 = this->model;
      iVar23 = pHVar19->num_row_;
      lVar24 = (long)iVar23;
      pHVar19->num_row_ = iVar23 + 1;
      local_3d0._M_impl.super__Vector_impl_data._M_start[uVar27] = iVar23;
      if (lVar24 < (long)uVar27) {
        pdVar6 = (pHVar19->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar27];
        pdVar6 = (pHVar19->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar27];
        pdVar6 = (this->rowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar27];
        pdVar6 = (this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar27];
        pdVar6 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar27];
        pdVar6 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar6[lVar24] = pdVar6[uVar27];
        piVar8 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8[lVar24] = piVar8[uVar27];
        piVar8 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8[local_3d0._M_impl.super__Vector_impl_data._M_start[uVar27]] = piVar8[uVar27];
        psVar9 = (this_02->
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=(&psVar9[local_3d0._M_impl.super__Vector_impl_data._M_start[uVar27]]._M_t,
                  (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  ((long)&(psVar9->_M_t)._M_impl.field_0x0 + lVar29));
        piVar8 = (local_380->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8[local_3d0._M_impl.super__Vector_impl_data._M_start[uVar27]] = piVar8[uVar27];
        piVar8 = (local_378->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8[local_3d0._M_impl.super__Vector_impl_data._M_start[uVar27]] = piVar8[uVar27];
        piVar8 = (local_388->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8[local_3d0._M_impl.super__Vector_impl_data._M_start[uVar27]] = piVar8[uVar27];
        piVar8 = (local_398->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8[local_3d0._M_impl.super__Vector_impl_data._M_start[uVar27]] = piVar8[uVar27];
        if (local_390 != pbVar4) {
          pbVar5 = (this->model->row_names_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::operator=
                    ((string *)(pbVar5 + local_3d0._M_impl.super__Vector_impl_data._M_start[uVar27])
                     ,(string *)((long)&(pbVar5->_M_dataplus)._M_p + lVar28));
        }
        puVar11 = (local_3a0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar11[local_3d0._M_impl.super__Vector_impl_data._M_start[uVar27]] = puVar11[uVar27];
      }
    }
    else {
      local_3d0._M_impl.super__Vector_impl_data._M_start[uVar27] = -1;
    }
    lVar29 = lVar29 + 0x30;
    lVar28 = lVar28 + 0x20;
  }
  pHVar19 = this->model;
  piVar8 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar12 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (uVar27 = 0; uVar27 != (uint)pHVar19->num_col_; uVar27 = uVar27 + 1) {
    lVar28 = (long)piVar8[uVar27];
    if (lVar28 != -1) {
      piVar8[uVar27] = local_3d0._M_impl.super__Vector_impl_data._M_start[lVar28];
    }
    lVar28 = (long)piVar12[uVar27];
    if (lVar28 != -1) {
      piVar12[uVar27] = local_3d0._M_impl.super__Vector_impl_data._M_start[lVar28];
    }
  }
  piVar8 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar12 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  for (uVar27 = 0; uVar27 != (uint)pHVar19->num_row_; uVar27 = uVar27 + 1) {
    lVar28 = (long)piVar8[uVar27];
    if (lVar28 != -1) {
      piVar8[uVar27] = local_3e8._M_impl.super__Vector_impl_data._M_start[lVar28];
    }
    lVar28 = (long)piVar12[uVar27];
    if (lVar28 != -1) {
      piVar12[uVar27] = local_3e8._M_impl.super__Vector_impl_data._M_start[lVar28];
    }
  }
  for (uVar27 = 0; uVar27 != (uint)pHVar19->num_col_; uVar27 = uVar27 + 1) {
    local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&local_368.changedcolsflags_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
    local_368.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar9 = (local_3b0->
             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_368.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_368.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    for (p_Var18 = *(_Base_ptr *)((long)&psVar9[uVar27]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var18 != &psVar9[uVar27]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
      if (local_3d0._M_impl.super__Vector_impl_data._M_start[(int)p_Var18[1]._M_color] != -1) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_emplace_unique<int&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_368,
                   local_3d0._M_impl.super__Vector_impl_data._M_start + (int)p_Var18[1]._M_color);
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
              (&(this->implRowDualSourceByCol).
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar27]._M_t,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &local_368);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &local_368);
    pHVar19 = this->model;
  }
  for (uVar27 = 0; uVar27 != (uint)pHVar19->num_row_; uVar27 = uVar27 + 1) {
    local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&local_368.changedcolsflags_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
    local_368.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar9 = (this_02->
             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_368.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_368.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    for (p_Var18 = *(_Base_ptr *)((long)&psVar9[uVar27]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var18 != &psVar9[uVar27]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
      if (local_3e8._M_impl.super__Vector_impl_data._M_start[(int)p_Var18[1]._M_color] != -1) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_emplace_unique<int&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_368,
                   local_3e8._M_impl.super__Vector_impl_data._M_start + (int)p_Var18[1]._M_color);
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
              (&(this->colImplSourceByRow).
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar27]._M_t,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &local_368);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &local_368);
    pHVar19 = this->model;
  }
  local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_368.changedcolsflags_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (&this->rowDeleted,(long)pHVar19->num_row_,(value_type_conflict5 *)&local_368);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->row_lower_,(long)this->model->num_row_);
  this_04 = local_370;
  this_03 = local_378;
  pbVar4 = local_3a8;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->row_upper_,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->rowDualLower,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->rowDualUpper,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implRowDualLower,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implRowDualUpper,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(this_01,(long)this->model->num_row_);
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::resize(this_02,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(local_380,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(this_03,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(local_388,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(local_398,(long)this->model->num_row_);
  if (local_390 != pbVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->model->row_names_,(long)this->model->num_row_);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (local_3a0,(long)this->model->num_row_);
  this->numDeletedRows = 0;
  HighsPostsolveStack::compressIndexMaps
            (this_04,(vector<int,_std::allocator<int>_> *)&local_3d0,
             (vector<int,_std::allocator<int>_> *)&local_3e8);
  HighsLinearSumBounds::shrink
            (&this->impliedRowBounds,(vector<int,_std::allocator<int>_> *)&local_3d0,
             this->model->num_row_);
  HighsLinearSumBounds::shrink
            (&this->impliedDualRowBounds,(vector<int,_std::allocator<int>_> *)&local_3e8,
             this->model->num_col_);
  pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar13 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  piVar8 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar12 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (uVar27 = 0; ((ulong)((long)pdVar13 - (long)pdVar6) >> 3 & 0xffffffff) != uVar27;
      uVar27 = uVar27 + 1) {
    dVar2 = pdVar6[uVar27];
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      piVar8[uVar27] = local_3e8._M_impl.super__Vector_impl_data._M_start[piVar8[uVar27]];
      piVar12[uVar27] = local_3d0._M_impl.super__Vector_impl_data._M_start[piVar12[uVar27]];
    }
  }
  _Var14._M_current =
       (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var20._M_current =
       (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var25._M_current = _Var20._M_current; _Var25._M_current != _Var14._M_current;
      _Var25._M_current = _Var25._M_current + 1) {
    *_Var25._M_current = local_3e8._M_impl.super__Vector_impl_data._M_start[*_Var25._M_current];
  }
  local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  _Var20 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var20,_Var14,(_Iter_equals_val<const_int>)&local_368);
  std::vector<int,_std::allocator<int>_>::erase
            (&this->singletonColumns,(const_iterator)_Var20._M_current,
             (const_iterator)
             (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  _Var14._M_current =
       (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var20._M_current =
       (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var25._M_current = _Var20._M_current; _Var25._M_current != _Var14._M_current;
      _Var25._M_current = _Var25._M_current + 1) {
    *_Var25._M_current = local_3e8._M_impl.super__Vector_impl_data._M_start[*_Var25._M_current];
  }
  local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  _Var20 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var20,_Var14,(_Iter_equals_val<const_int>)&local_368);
  std::vector<int,_std::allocator<int>_>::erase
            (&this->changedColIndices,(const_iterator)_Var20._M_current,
             (const_iterator)
             (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  _Var14._M_current =
       (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var20._M_current =
       (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var25._M_current = _Var20._M_current; _Var25._M_current != _Var14._M_current;
      _Var25._M_current = _Var25._M_current + 1) {
    *_Var25._M_current = local_3d0._M_impl.super__Vector_impl_data._M_start[*_Var25._M_current];
  }
  local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  _Var20 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var20,_Var14,(_Iter_equals_val<const_int>)&local_368);
  std::vector<int,_std::allocator<int>_>::erase
            (&this->singletonRows,(const_iterator)_Var20._M_current,
             (const_iterator)
             (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  _Var14._M_current =
       (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var20._M_current =
       (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var25._M_current = _Var20._M_current; _Var25._M_current != _Var14._M_current;
      _Var25._M_current = _Var25._M_current + 1) {
    *_Var25._M_current = local_3d0._M_impl.super__Vector_impl_data._M_start[*_Var25._M_current];
  }
  local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_368.changedcolsflags_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0xffffffff);
  _Var20 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var20,_Var14,(_Iter_equals_val<const_int>)&local_368);
  std::vector<int,_std::allocator<int>_>::erase
            (&this->changedRowIndices,(const_iterator)_Var20._M_current,
             (const_iterator)
             (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  __last._M_current =
       (this->substitutionOpportunities).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ppVar21 = (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (ppVar26 = ppVar21; ppVar26 != __last._M_current; ppVar26 = ppVar26 + 1) {
    if ((long)ppVar26->first != -1) {
      ppVar26->first = local_3d0._M_impl.super__Vector_impl_data._M_start[ppVar26->first];
      ppVar26->second = local_3e8._M_impl.super__Vector_impl_data._M_start[ppVar26->second];
    }
  }
  lVar29 = (long)__last._M_current - (long)ppVar21;
  ppVar21 = ppVar21 + 2;
  for (lVar28 = lVar29 >> 5; 0 < lVar28; lVar28 = lVar28 + -1) {
    if ((ppVar21[-2].first == -1) || (ppVar21[-2].second == -1)) {
      ppVar26 = ppVar21 + -2;
      goto LAB_00302ae3;
    }
    if ((ppVar21[-1].first == -1) || (ppVar21[-1].second == -1)) {
      ppVar26 = ppVar21 + -1;
      goto LAB_00302ae3;
    }
    ppVar26 = ppVar21;
    if ((ppVar21->first == -1) || (ppVar21->second == -1)) goto LAB_00302ae3;
    if ((ppVar21[1].first == -1) || (ppVar21[1].second == -1)) {
      ppVar26 = ppVar21 + 1;
      goto LAB_00302ae3;
    }
    ppVar21 = ppVar21 + 4;
    lVar29 = lVar29 + -0x20;
  }
  lVar29 = lVar29 >> 3;
  ppVar26 = ppVar21 + -2;
  if (lVar29 == 1) {
LAB_00302de4:
    cVar22._M_current = __last._M_current;
    if (ppVar26->second == -1) {
      cVar22._M_current = ppVar26;
    }
    if (ppVar26->first != -1) {
      ppVar26 = cVar22._M_current;
    }
  }
  else if (lVar29 == 3) {
    if ((ppVar21[-2].first != -1) && (ppVar21[-2].second != -1)) {
      ppVar26 = ppVar21 + -1;
      goto LAB_00302dcd;
    }
  }
  else {
    cVar22._M_current = __last._M_current;
    if (lVar29 != 2) goto LAB_00302b1e;
LAB_00302dcd:
    if ((ppVar26->first != -1) && (ppVar26->second != -1)) {
      ppVar26 = ppVar26 + 1;
      goto LAB_00302de4;
    }
  }
LAB_00302ae3:
  cVar22._M_current = ppVar26;
  if (ppVar26 != __last._M_current) {
    do {
      ppVar21 = ppVar26 + 1;
      do {
        ppVar26 = ppVar21;
        if (ppVar26 == __last._M_current) goto LAB_00302b1e;
        ppVar21 = ppVar26 + 1;
      } while ((ppVar26->first == -1) || (ppVar26->second == -1));
      (cVar22._M_current)->first = ppVar26->first;
      (cVar22._M_current)->second = ppVar26->second;
      cVar22._M_current = cVar22._M_current + 1;
    } while( true );
  }
LAB_00302b1e:
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
            (&this->substitutionOpportunities,cVar22,__last);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::clear(&(this->equations)._M_t);
  local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)&(this->equations)._M_t._M_impl.super__Rb_tree_header;
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ::_M_fill_assign(&this->eqiters,(long)this->model->num_row_,(value_type *)&local_368);
  iVar23 = 0;
  while( true ) {
    local_368.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_368.changedcolsflags_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,iVar23);
    pHVar19 = this->model;
    if (iVar23 == pHVar19->num_row_) break;
    dVar2 = (pHVar19->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar23];
    pdVar1 = (pHVar19->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + iVar23;
    if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
      pVar31 = std::
               _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
               ::_M_emplace_unique<int&,int&>
                         ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                           *)&this->equations,
                          (this_03->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + iVar23,(int *)&local_368);
      (this->eqiters).
      super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start
      [(int)local_368.changedcolsflags_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start]._M_node = pVar31.first._M_node._M_node;
      iVar23 = (int)local_368.changedcolsflags_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    iVar23 = iVar23 + 1;
  }
  mipsolver = this->mipsolver;
  if (mipsolver != (HighsMipSolver *)0x0) {
    ((mipsolver->mipdata_)._M_t.
     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
     super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->rowMatrixSet = false;
    HighsObjectiveFunction::HighsObjectiveFunction((HighsObjectiveFunction *)&local_368,mipsolver);
    HighsObjectiveFunction::operator=
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                objectiveFunction,(HighsObjectiveFunction *)&local_368);
    HighsObjectiveFunction::~HighsObjectiveFunction((HighsObjectiveFunction *)&local_368);
    HighsDomain::HighsDomain(&local_368,this->mipsolver);
    HighsDomain::operator=
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain,
               &local_368);
    HighsDomain::~HighsDomain(&local_368);
    pHVar15 = (this->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    HighsCliqueTable::rebuild
              (&pHVar15->cliquetable,this->model->num_col_,this_04,&pHVar15->domain,
               (vector<int,_std::allocator<int>_> *)&local_3e8,
               (vector<int,_std::allocator<int>_> *)&local_3d0);
    HighsImplications::rebuild
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->implications,
               this->model->num_col_,(vector<int,_std::allocator<int>_> *)&local_3e8,
               (vector<int,_std::allocator<int>_> *)&local_3d0);
    pHVar16 = this->mipsolver->options_mip_;
    HighsCutPool::HighsCutPool
              ((HighsCutPool *)&local_368,this->mipsolver->model_->num_col_,
               (pHVar16->super_HighsOptionsStruct).mip_pool_age_limit,
               (pHVar16->super_HighsOptionsStruct).mip_pool_soft_limit);
    HighsCutPool::operator=
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool,
               (HighsCutPool *)&local_368);
    HighsCutPool::~HighsCutPool((HighsCutPool *)&local_368);
    pHVar16 = this->mipsolver->options_mip_;
    HighsConflictPool::HighsConflictPool
              ((HighsConflictPool *)&local_368,
               (pHVar16->super_HighsOptionsStruct).mip_pool_age_limit * 5,
               (pHVar16->super_HighsOptionsStruct).mip_pool_soft_limit);
    HighsConflictPool::operator=
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->conflictPool,
               (HighsConflictPool *)&local_368);
    HighsConflictPool::~HighsConflictPool((HighsConflictPool *)&local_368);
    puVar17 = (this->numProbes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (uVar27 = 0; local_3b8 != uVar27; uVar27 = uVar27 + 1) {
      if ((long)local_3e8._M_impl.super__Vector_impl_data._M_start[uVar27] != -1) {
        puVar17[local_3e8._M_impl.super__Vector_impl_data._M_start[uVar27]] = puVar17[uVar27];
      }
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&this->numProbes,(long)this->model->num_col_);
    HighsLp::setMatrixDimensions(this->model);
    pHVar19 = this->model;
  }
  HighsLp::setMatrixDimensions(pHVar19);
  HPresolveAnalysis::resetNumDeleted(&this->analysis_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3e8);
  return;
}

Assistant:

void HPresolve::shrinkProblem(HighsPostsolveStack& postsolve_stack) {
  HighsInt oldNumCol = model->num_col_;
  model->num_col_ = 0;
  std::vector<HighsInt> newColIndex(oldNumCol);
  const bool have_col_names = model->col_names_.size() > 0;
  assert(!have_col_names ||
         model->col_names_.size() == static_cast<size_t>(oldNumCol));
  for (HighsInt i = 0; i != oldNumCol; ++i) {
    if (colDeleted[i])
      newColIndex[i] = -1;
    else {
      newColIndex[i] = model->num_col_++;
      if (newColIndex[i] < i) {
        model->col_cost_[newColIndex[i]] = model->col_cost_[i];
        model->col_lower_[newColIndex[i]] = model->col_lower_[i];
        model->col_upper_[newColIndex[i]] = model->col_upper_[i];
        assert(!std::isnan(model->col_lower_[newColIndex[i]]));
        assert(!std::isnan(model->col_upper_[newColIndex[i]]));
        model->integrality_[newColIndex[i]] = model->integrality_[i];
        implColLower[newColIndex[i]] = implColLower[i];
        implColUpper[newColIndex[i]] = implColUpper[i];
        colLowerSource[newColIndex[i]] = colLowerSource[i];
        colUpperSource[newColIndex[i]] = colUpperSource[i];
        implRowDualSourceByCol[newColIndex[i]] = implRowDualSourceByCol[i];
        colhead[newColIndex[i]] = colhead[i];
        colsize[newColIndex[i]] = colsize[i];
        if (have_col_names)
          model->col_names_[newColIndex[i]] = std::move(model->col_names_[i]);
        changedColFlag[newColIndex[i]] = changedColFlag[i];
      }
    }
  }
  colDeleted.assign(model->num_col_, false);
  model->col_cost_.resize(model->num_col_);
  model->col_lower_.resize(model->num_col_);
  model->col_upper_.resize(model->num_col_);
  model->integrality_.resize(model->num_col_);
  implColLower.resize(model->num_col_);
  implColUpper.resize(model->num_col_);
  colLowerSource.resize(model->num_col_);
  colUpperSource.resize(model->num_col_);
  implRowDualSourceByCol.resize(model->num_col_);
  colhead.resize(model->num_col_);
  colsize.resize(model->num_col_);
  if (have_col_names) model->col_names_.resize(model->num_col_);
  changedColFlag.resize(model->num_col_);
  numDeletedCols = 0;
  HighsInt oldNumRow = model->num_row_;
  const bool have_row_names = model->row_names_.size() > 0;
  assert(!have_row_names ||
         model->row_names_.size() == static_cast<size_t>(oldNumRow));
  model->num_row_ = 0;
  std::vector<HighsInt> newRowIndex(oldNumRow);
  for (HighsInt i = 0; i != oldNumRow; ++i) {
    if (rowDeleted[i])
      newRowIndex[i] = -1;
    else {
      newRowIndex[i] = model->num_row_++;
      if (newRowIndex[i] < i) {
        model->row_lower_[newRowIndex[i]] = model->row_lower_[i];
        model->row_upper_[newRowIndex[i]] = model->row_upper_[i];
        assert(!std::isnan(model->row_lower_[newRowIndex[i]]));
        assert(!std::isnan(model->row_upper_[newRowIndex[i]]));
        rowDualLower[newRowIndex[i]] = rowDualLower[i];
        rowDualUpper[newRowIndex[i]] = rowDualUpper[i];
        implRowDualLower[newRowIndex[i]] = implRowDualLower[i];
        implRowDualUpper[newRowIndex[i]] = implRowDualUpper[i];
        rowDualLowerSource[newRowIndex[i]] = rowDualLowerSource[i];
        rowDualUpperSource[newRowIndex[i]] = rowDualUpperSource[i];
        colImplSourceByRow[newRowIndex[i]] = colImplSourceByRow[i];
        rowroot[newRowIndex[i]] = rowroot[i];
        rowsize[newRowIndex[i]] = rowsize[i];
        rowsizeInteger[newRowIndex[i]] = rowsizeInteger[i];
        rowsizeImplInt[newRowIndex[i]] = rowsizeImplInt[i];
        if (have_row_names)
          model->row_names_[newRowIndex[i]] = std::move(model->row_names_[i]);
        changedRowFlag[newRowIndex[i]] = changedRowFlag[i];
      }
    }
  }
  for (HighsInt i = 0; i != model->num_col_; ++i) {
    if (colLowerSource[i] != -1)
      colLowerSource[i] = newRowIndex[colLowerSource[i]];
    if (colUpperSource[i] != -1)
      colUpperSource[i] = newRowIndex[colUpperSource[i]];
  }

  for (HighsInt i = 0; i != model->num_row_; ++i) {
    if (rowDualLowerSource[i] != -1)
      rowDualLowerSource[i] = newColIndex[rowDualLowerSource[i]];
    if (rowDualUpperSource[i] != -1)
      rowDualUpperSource[i] = newColIndex[rowDualUpperSource[i]];
  }

  for (HighsInt i = 0; i != model->num_col_; ++i) {
    std::set<HighsInt> newSet;
    std::for_each(implRowDualSourceByCol[i].cbegin(),
                  implRowDualSourceByCol[i].cend(), [&](const HighsInt& row) {
                    if (newRowIndex[row] != -1)
                      newSet.emplace(newRowIndex[row]);
                  });
    implRowDualSourceByCol[i] = std::move(newSet);
  }

  for (HighsInt i = 0; i != model->num_row_; ++i) {
    std::set<HighsInt> newSet;
    std::for_each(colImplSourceByRow[i].cbegin(), colImplSourceByRow[i].cend(),
                  [&](const HighsInt& col) {
                    if (newColIndex[col] != -1)
                      newSet.emplace(newColIndex[col]);
                  });
    colImplSourceByRow[i] = std::move(newSet);
  }
  rowDeleted.assign(model->num_row_, false);
  model->row_lower_.resize(model->num_row_);
  model->row_upper_.resize(model->num_row_);
  rowDualLower.resize(model->num_row_);
  rowDualUpper.resize(model->num_row_);
  implRowDualLower.resize(model->num_row_);
  implRowDualUpper.resize(model->num_row_);
  rowDualLowerSource.resize(model->num_row_);
  rowDualUpperSource.resize(model->num_row_);
  colImplSourceByRow.resize(model->num_row_);
  rowroot.resize(model->num_row_);
  rowsize.resize(model->num_row_);
  rowsizeInteger.resize(model->num_row_);
  rowsizeImplInt.resize(model->num_row_);
  if (have_row_names) model->row_names_.resize(model->num_row_);
  changedRowFlag.resize(model->num_row_);

  numDeletedRows = 0;
  postsolve_stack.compressIndexMaps(newRowIndex, newColIndex);
  impliedRowBounds.shrink(newRowIndex, model->num_row_);
  impliedDualRowBounds.shrink(newColIndex, model->num_col_);

  HighsInt numNnz = Avalue.size();
  for (HighsInt i = 0; i != numNnz; ++i) {
    if (Avalue[i] == 0) continue;
    assert(newColIndex[Acol[i]] != -1);
    assert(newRowIndex[Arow[i]] != -1);
    Acol[i] = newColIndex[Acol[i]];
    Arow[i] = newRowIndex[Arow[i]];
  }

  // update index sets
  for (HighsInt& singCol : singletonColumns) singCol = newColIndex[singCol];
  singletonColumns.erase(
      std::remove(singletonColumns.begin(), singletonColumns.end(), -1),
      singletonColumns.end());

  for (HighsInt& chgCol : changedColIndices) chgCol = newColIndex[chgCol];
  changedColIndices.erase(
      std::remove(changedColIndices.begin(), changedColIndices.end(), -1),
      changedColIndices.end());

  for (HighsInt& singRow : singletonRows) singRow = newRowIndex[singRow];
  singletonRows.erase(
      std::remove(singletonRows.begin(), singletonRows.end(), -1),
      singletonRows.end());

  for (HighsInt& chgRow : changedRowIndices) chgRow = newRowIndex[chgRow];
  changedRowIndices.erase(
      std::remove(changedRowIndices.begin(), changedRowIndices.end(), -1),
      changedRowIndices.end());

  for (auto& rowColPair : substitutionOpportunities) {
    // skip deleted elements
    if (rowColPair.first == -1) continue;
    rowColPair.first = newRowIndex[rowColPair.first];
    rowColPair.second = newColIndex[rowColPair.second];
  }
  substitutionOpportunities.erase(
      std::remove_if(substitutionOpportunities.begin(),
                     substitutionOpportunities.end(),
                     [&](const std::pair<HighsInt, HighsInt>& p) {
                       return p.first == -1 || p.second == -1;
                     }),
      substitutionOpportunities.end());

  // todo remove equation set and replace with a vector of doubleton eqs
  equations.clear();
  eqiters.assign(model->num_row_, equations.end());
  for (HighsInt i = 0; i != model->num_row_; ++i) {
    if (model->row_lower_[i] == model->row_upper_[i])
      eqiters[i] = equations.emplace(rowsize[i], i).first;
  }

  if (mipsolver != nullptr) {
    mipsolver->mipdata_->rowMatrixSet = false;
    mipsolver->mipdata_->objectiveFunction = HighsObjectiveFunction(*mipsolver);
    mipsolver->mipdata_->domain = HighsDomain(*mipsolver);
    mipsolver->mipdata_->cliquetable.rebuild(model->num_col_, postsolve_stack,
                                             mipsolver->mipdata_->domain,
                                             newColIndex, newRowIndex);
    mipsolver->mipdata_->implications.rebuild(model->num_col_, newColIndex,
                                              newRowIndex);
    mipsolver->mipdata_->cutpool =
        HighsCutPool(mipsolver->model_->num_col_,
                     mipsolver->options_mip_->mip_pool_age_limit,
                     mipsolver->options_mip_->mip_pool_soft_limit);
    mipsolver->mipdata_->conflictPool =
        HighsConflictPool(5 * mipsolver->options_mip_->mip_pool_age_limit,
                          mipsolver->options_mip_->mip_pool_soft_limit);

    for (HighsInt i = 0; i != oldNumCol; ++i)
      if (newColIndex[i] != -1) numProbes[newColIndex[i]] = numProbes[i];

    mipsolver->mipdata_->debugSolution.shrink(newColIndex);
    numProbes.resize(model->num_col_);
    // Need to set the constraint matrix dimensions
    model->setMatrixDimensions();
  }
  // Need to set the constraint matrix dimensions
  model->setMatrixDimensions();
  // Need to reset current number of deleted rows and columns in logging
  analysis_.resetNumDeleted();
}